

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O1

void __thiscall
spdlog::details::H_formatter<spdlog::details::scoped_padder>::format
          (H_formatter<spdlog::details::scoped_padder> *this,log_msg *param_1,tm *tm_time,
          memory_buf_t *dest)

{
  uint uVar1;
  size_t sVar2;
  ulong uVar3;
  basic_string_view<char> format_str;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  args;
  scoped_padder p;
  scoped_padder local_50;
  ulong local_28 [2];
  
  scoped_padder::scoped_padder(&local_50,2,&(this->super_flag_formatter).padinfo_,dest);
  uVar1 = tm_time->tm_hour;
  uVar3 = (ulong)uVar1;
  if (uVar3 < 100) {
    if ((dest->super_buffer<char>).capacity_ < (dest->super_buffer<char>).size_ + 1) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest);
    }
    sVar2 = (dest->super_buffer<char>).size_;
    (dest->super_buffer<char>).size_ = sVar2 + 1;
    (dest->super_buffer<char>).ptr_[sVar2] = (byte)(uVar3 / 10) | 0x30;
    if ((dest->super_buffer<char>).capacity_ < (dest->super_buffer<char>).size_ + 1) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest);
    }
    sVar2 = (dest->super_buffer<char>).size_;
    (dest->super_buffer<char>).size_ = sVar2 + 1;
    (dest->super_buffer<char>).ptr_[sVar2] =
         (char)uVar1 + ((char)(uVar1 / 10) + (char)(uVar1 / 10)) * -5 | 0x30;
  }
  else {
    format_str.size_ = 5;
    format_str.data_ = "{:02}";
    args.field_1.values_ =
         (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)
         local_28;
    args.desc_ = 1;
    local_28[0] = uVar3;
    ::fmt::v7::detail::vformat_to<char>(&dest->super_buffer<char>,format_str,args,(locale_ref)0x0);
  }
  scoped_padder::~scoped_padder(&local_50);
  return;
}

Assistant:

void format(const details::log_msg &, const std::tm &tm_time, memory_buf_t &dest) override
    {
        const size_t field_size = 2;
        ScopedPadder p(field_size, padinfo_, dest);
        fmt_helper::pad2(tm_time.tm_hour, dest);
    }